

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::InitializeFromParent(cmMakefile *this,cmMakefile *parent)

{
  cmMakefile *pcVar1;
  bool bVar2;
  Internals *this_00;
  char *pcVar3;
  reference s;
  char *prop_1;
  allocator local_221;
  undefined1 local_220 [8];
  string defPropName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  const_iterator ci;
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_1a8;
  allocator local_181;
  string local_180;
  PolicyStatus local_160;
  allocator local_159;
  PolicyStatus polSt;
  allocator local_131;
  string local_130;
  char *local_110;
  char *prop;
  cmValueWithOrigin *local_100;
  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_f8;
  __normal_iterator<cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_f0;
  const_iterator local_e8;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *local_e0;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *parentDefines;
  cmValueWithOrigin *local_d0;
  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_c8;
  __normal_iterator<cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_c0;
  const_iterator local_b8;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *local_b0;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *parentOptions;
  cmValueWithOrigin *local_a0;
  __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_98;
  __normal_iterator<cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
  local_90;
  const_iterator local_88;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *local_80;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *parentIncludes;
  string local_70;
  allocator local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *parent_local;
  cmMakefile *this_local;
  
  local_18 = parent;
  parent_local = this;
  this_00 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
  Internals::InitializeDefinitions(this_00,local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_CURRENT_SOURCE_DIR",&local_39);
  pcVar3 = GetCurrentSourceDirectory(this);
  AddDefinition(this,&local_38,pcVar3);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"CMAKE_CURRENT_BINARY_DIR",(allocator *)((long)&parentIncludes + 7)
            );
  pcVar3 = GetCurrentBinaryDirectory(this);
  AddDefinition(this,&local_70,pcVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&parentIncludes + 7));
  local_80 = GetIncludeDirectoriesEntries(local_18);
  local_90._M_current =
       (cmValueWithOrigin *)
       std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                 (&this->IncludeDirectoriesEntries);
  __gnu_cxx::
  __normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
  ::__normal_iterator<cmValueWithOrigin*>
            ((__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
              *)&local_88,&local_90);
  local_98._M_current =
       (cmValueWithOrigin *)
       std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin(local_80);
  local_a0 = (cmValueWithOrigin *)
             std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end(local_80);
  parentOptions =
       (vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)
       std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>::
       insert<__gnu_cxx::__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>,void>
                 ((vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>> *)
                  &this->IncludeDirectoriesEntries,local_88,local_98,
                  (__normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                   )local_a0);
  local_b0 = GetCompileOptionsEntries(local_18);
  local_c0._M_current =
       (cmValueWithOrigin *)
       std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                 (&this->CompileOptionsEntries);
  __gnu_cxx::
  __normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
  ::__normal_iterator<cmValueWithOrigin*>
            ((__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
              *)&local_b8,&local_c0);
  local_c8._M_current =
       (cmValueWithOrigin *)
       std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin(local_b0);
  local_d0 = (cmValueWithOrigin *)
             std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end(local_b0);
  parentDefines =
       (vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> *)
       std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>::
       insert<__gnu_cxx::__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>,void>
                 ((vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>> *)
                  &this->CompileOptionsEntries,local_b8,local_c8,
                  (__normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                   )local_d0);
  local_e0 = GetCompileDefinitionsEntries(local_18);
  local_f0._M_current =
       (cmValueWithOrigin *)
       std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                 (&this->CompileDefinitionsEntries);
  __gnu_cxx::
  __normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
  ::__normal_iterator<cmValueWithOrigin*>
            ((__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
              *)&local_e8,&local_f0);
  local_f8._M_current =
       (cmValueWithOrigin *)
       std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin(local_e0);
  local_100 = (cmValueWithOrigin *)
              std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end(local_e0);
  prop = (char *)std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>::
                 insert<__gnu_cxx::__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>,void>
                           ((vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>> *)
                            &this->CompileDefinitionsEntries,local_e8,local_f8,
                            (__normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                             )local_100);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->SystemIncludeDirectories,&local_18->SystemIncludeDirectories);
  std::__cxx11::string::operator=((string *)&this->DefineFlags,(string *)&local_18->DefineFlags);
  std::__cxx11::string::operator=
            ((string *)&this->DefineFlagsOrig,(string *)&local_18->DefineFlagsOrig);
  local_110 = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",&local_131)
  ;
  pcVar1 = local_18;
  pcVar3 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&polSt,pcVar3,&local_159);
  pcVar3 = GetProperty(pcVar1,(string *)&polSt);
  SetProperty(this,&local_130,pcVar3);
  std::__cxx11::string::~string((string *)&polSt);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_160 = GetPolicyStatus(this,CMP0043);
  if ((local_160 == WARN) || (local_160 == OLD)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"COMPILE_DEFINITIONS",&local_181);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1a8,"COMPILE_DEFINITIONS",
               (allocator *)
               ((long)&configs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = GetProperty(pcVar1,&local_1a8);
    SetProperty(this,&local_180,pcVar3);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&configs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c8);
    GetConfigurations((string *)&ci,this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1c8,true);
    std::__cxx11::string::~string((string *)&ci);
    local_1f8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1f0,&local_1f8);
    while( true ) {
      defPropName.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1f0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&defPropName.field_2 + 8));
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_220,"COMPILE_DEFINITIONS_",&local_221);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      s = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_1f0);
      cmsys::SystemTools::UpperCase((string *)&prop_1,s);
      std::__cxx11::string::operator+=((string *)local_220,(string *)&prop_1);
      std::__cxx11::string::~string((string *)&prop_1);
      pcVar3 = GetProperty(local_18,(string *)local_220);
      SetProperty(this,(string *)local_220,pcVar3);
      std::__cxx11::string::~string((string *)local_220);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1f0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
  ::operator=(&this->LinkLibraries,&local_18->LinkLibraries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->LinkDirectories,&local_18->LinkDirectories);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_18->ProjectName);
  std::__cxx11::string::operator=
            ((string *)&this->IncludeFileRegularExpression,
             (string *)&local_18->IncludeFileRegularExpression);
  std::__cxx11::string::operator=
            ((string *)&this->ComplainFileRegularExpression,
             (string *)&local_18->ComplainFileRegularExpression);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::operator=(&this->ImportedTargets,&local_18->ImportedTargets);
  return;
}

Assistant:

void cmMakefile::InitializeFromParent(cmMakefile* parent)
{
  // Initialize definitions with the closure of the parent scope.
  this->Internal->InitializeDefinitions(parent);

  this->AddDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->GetCurrentSourceDirectory());
  this->AddDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->GetCurrentBinaryDirectory());

  const std::vector<cmValueWithOrigin>& parentIncludes =
                                        parent->GetIncludeDirectoriesEntries();
  this->IncludeDirectoriesEntries.insert(this->IncludeDirectoriesEntries.end(),
                                         parentIncludes.begin(),
                                         parentIncludes.end());

  const std::vector<cmValueWithOrigin>& parentOptions =
                                        parent->GetCompileOptionsEntries();
  this->CompileOptionsEntries.insert(this->CompileOptionsEntries.end(),
                                     parentOptions.begin(),
                                     parentOptions.end());

  const std::vector<cmValueWithOrigin>& parentDefines =
                                      parent->GetCompileDefinitionsEntries();
  this->CompileDefinitionsEntries.insert(this->CompileDefinitionsEntries.end(),
                                         parentDefines.begin(),
                                         parentDefines.end());

  this->SystemIncludeDirectories = parent->SystemIncludeDirectories;

  // define flags
  this->DefineFlags = parent->DefineFlags;
  this->DefineFlagsOrig = parent->DefineFlagsOrig;

  // Include transform property.  There is no per-config version.
  {
  const char* prop = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
  this->SetProperty(prop, parent->GetProperty(prop));
  }

  // compile definitions property and per-config versions
  cmPolicies::PolicyStatus polSt = this->GetPolicyStatus(cmPolicies::CMP0043);
  if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD)
    {
    this->SetProperty("COMPILE_DEFINITIONS",
                      parent->GetProperty("COMPILE_DEFINITIONS"));
    std::vector<std::string> configs;
    this->GetConfigurations(configs);
    for(std::vector<std::string>::const_iterator ci = configs.begin();
        ci != configs.end(); ++ci)
      {
      std::string defPropName = "COMPILE_DEFINITIONS_";
      defPropName += cmSystemTools::UpperCase(*ci);
      const char* prop = parent->GetProperty(defPropName);
      this->SetProperty(defPropName, prop);
      }
    }

  // link libraries
  this->LinkLibraries = parent->LinkLibraries;

  // link directories
  this->LinkDirectories = parent->LinkDirectories;

  // the initial project name
  this->ProjectName = parent->ProjectName;

  // Copy include regular expressions.
  this->IncludeFileRegularExpression = parent->IncludeFileRegularExpression;
  this->ComplainFileRegularExpression = parent->ComplainFileRegularExpression;

  // Imported targets.
  this->ImportedTargets = parent->ImportedTargets;
}